

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFactory.cpp
# Opt level: O0

Activation * __thiscall
PyreNet::ActivationFactory::getActivation(ActivationFactory *this,activationType activation)

{
  mapped_type pAVar1;
  bool bVar2;
  Activation *pAVar3;
  mapped_type *ppAVar4;
  _Node_iterator_base<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_false>
  local_48 [3];
  _Node_iterator_base<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_false>
  local_30;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lg;
  activationType activation_local;
  ActivationFactory *this_local;
  
  lg._12_4_ = activation;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_28,(mutex_type *)instanceMutex);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*,_std::hash<PyreNet::LayerDefinition::activationType>,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>_>
       ::find(&this->activationCache,(key_type *)&lg.field_0xc);
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*,_std::hash<PyreNet::LayerDefinition::activationType>,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>_>
       ::end(&this->activationCache);
  bVar2 = std::__detail::operator==(&local_30,local_48);
  if (bVar2) {
    pAVar3 = generateActivation(this,lg._12_4_);
    ppAVar4 = std::
              unordered_map<PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*,_std::hash<PyreNet::LayerDefinition::activationType>,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>_>
              ::operator[](&this->activationCache,(key_type *)&lg.field_0xc);
    *ppAVar4 = pAVar3;
  }
  ppAVar4 = std::
            unordered_map<PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*,_std::hash<PyreNet::LayerDefinition::activationType>,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>_>
            ::operator[](&this->activationCache,(key_type *)&lg.field_0xc);
  pAVar1 = *ppAVar4;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return pAVar1;
}

Assistant:

Activation *ActivationFactory::getActivation(LayerDefinition::activationType activation) {
        std::unique_lock<std::mutex> lg(instanceMutex);
        if (this->activationCache.find(activation) == this->activationCache.end()) { // activation function not in cache
            this->activationCache[activation] = generateActivation(activation);
        }
        return this->activationCache[activation];
    }